

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O1

bool bloaty::wasm::ReadMagic(string_view *data)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  
  uVar2 = data->_M_len;
  if (3 < uVar2) {
    piVar3 = (int *)data->_M_str;
    iVar1 = *piVar3;
    data->_M_str = (char *)(piVar3 + 1);
    data->_M_len = uVar2 - 4;
    if (iVar1 == 0x6d736100) {
      if (uVar2 - 4 < 4) goto LAB_00199d8c;
      data->_M_str = (char *)(piVar3 + 2);
      data->_M_len = uVar2 - 8;
    }
    return iVar1 == 0x6d736100;
  }
LAB_00199d8c:
  Throw("premature EOF reading fixed-length data",0x8d);
}

Assistant:

bool ReadMagic(string_view* data) {
  const uint32_t wasm_magic = 0x6d736100;
  auto magic = ReadFixed<uint32_t>(data);

  if (magic != wasm_magic) {
    return false;
  }

  // TODO(haberman): do we need to fail if this is >1?
  auto version = ReadFixed<uint32_t>(data);
  (void)version;

  return true;
}